

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall
QL_Manager::SetUpNodesWithQO
          (QL_Manager *this,QL_Node **topNode,QO_Rel *qorels,int nSelAttrs,RelAttr *selAttrs)

{
  char *__s1;
  RC RVar1;
  int iVar2;
  size_t __n;
  QL_NodeProj *this_00;
  int local_6c;
  int local_68;
  int attrIndex;
  int i_1;
  QL_NodeProj *local_58;
  QL_NodeProj *projNode;
  QL_Node *pQStack_48;
  int i;
  QL_Node *currNode;
  RelAttr *pRStack_38;
  RC rc;
  RelAttr *selAttrs_local;
  QO_Rel *pQStack_28;
  int nSelAttrs_local;
  QO_Rel *qorels_local;
  QL_Node **topNode_local;
  QL_Manager *this_local;
  
  currNode._4_4_ = 0;
  pRStack_38 = selAttrs;
  selAttrs_local._4_4_ = nSelAttrs;
  pQStack_28 = qorels;
  qorels_local = (QO_Rel *)topNode;
  topNode_local = (QL_Node **)this;
  currNode._4_4_ = SetUpFirstNodeWithQO(this,topNode,qorels);
  this_local._4_4_ = currNode._4_4_;
  if (currNode._4_4_ == 0) {
    pQStack_48 = *(QL_Node **)qorels_local;
    for (projNode._4_4_ = 1; projNode._4_4_ < this->nRels; projNode._4_4_ = projNode._4_4_ + 1) {
      RVar1 = JoinRelationWithQO(this,(QL_Node **)qorels_local,pQStack_28,pQStack_48,projNode._4_4_)
      ;
      if (RVar1 != 0) {
        return RVar1;
      }
      pQStack_48 = *(QL_Node **)qorels_local;
      currNode._4_4_ = 0;
    }
    if (selAttrs_local._4_4_ == 1) {
      __s1 = pRStack_38->attrName;
      __n = strlen(pRStack_38->attrName);
      iVar2 = strncmp(__s1,"*",__n);
      if (iVar2 == 0) {
        return 0;
      }
    }
    this_00 = (QL_NodeProj *)operator_new(0x60);
    QL_NodeProj::QL_NodeProj(this_00,this,pQStack_48);
    local_58 = this_00;
    QL_NodeProj::SetUpNode(this_00,selAttrs_local._4_4_);
    for (local_68 = 0; local_68 < selAttrs_local._4_4_; local_68 = local_68 + 1) {
      local_6c = 0;
      currNode._4_4_ = GetAttrCatEntryPos(this,pRStack_38[local_68],&local_6c);
      if (currNode._4_4_ != 0) {
        return currNode._4_4_;
      }
      RVar1 = QL_NodeProj::AddProj(local_58,local_6c);
      if (RVar1 != 0) {
        return RVar1;
      }
      currNode._4_4_ = 0;
    }
    *(QL_NodeProj **)qorels_local = local_58;
    this_local._4_4_ = currNode._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::SetUpNodesWithQO(QL_Node *&topNode, QO_Rel* qorels, int nSelAttrs, const RelAttr selAttrs[]){
  RC rc = 0;
  if((rc = SetUpFirstNodeWithQO(topNode, qorels)))
    return (rc);

  // For all other relations, join it, left-deep style, with the previously
  // seen relations
  QL_Node* currNode;
  currNode = topNode;
  for(int i = 1; i < nRels; i++){
    if((rc = JoinRelationWithQO(topNode, qorels, currNode, i)))
      return (rc);
    currNode = topNode;
  }

  // If select *, don't add project nodes
  if((nSelAttrs == 1 && strncmp(selAttrs[0].attrName, "*", strlen(selAttrs[0].attrName)) == 0))
    return (0);
  // Otherwise, add a project node, and give it the attributes to project
  QL_NodeProj *projNode = new QL_NodeProj(*this, *currNode);
  projNode->SetUpNode(nSelAttrs);
  for(int i= 0 ; i < nSelAttrs; i++){
    int attrIndex = 0;
    if((rc = GetAttrCatEntryPos(selAttrs[i], attrIndex)))
      return (rc);
    if((rc = projNode->AddProj(attrIndex)))
      return (rc);
  }
  topNode = projNode;
  return (rc);
}